

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O3

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver *s,c_float *rho_vec)

{
  c_float *param2;
  long m;
  csc *pcVar1;
  csc *pcVar2;
  ulong uVar3;
  long lVar4;
  
  param2 = s->rho_inv_vec;
  m = s->m;
  if (0 < m) {
    lVar4 = 0;
    do {
      param2[lVar4] = 1.0 / rho_vec[lVar4];
      lVar4 = lVar4 + 1;
    } while (m != lVar4);
  }
  update_KKT_param2(s->KKT,param2,s->rhotoKKT,m);
  pcVar1 = s->KKT;
  pcVar2 = s->L;
  uVar3 = QDLDL_factor(pcVar1->n,pcVar1->p,pcVar1->i,pcVar1->x,pcVar2->p,pcVar2->i,pcVar2->x,s->D,
                       s->Dinv,s->Lnz,s->etree,s->bwork,s->iwork,s->fwork);
  return uVar3 >> 0x3f;
}

Assistant:

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver * s, const c_float * rho_vec){
    c_int i;

    // Update internal rho_inv_vec
    for (i = 0; i < s->m; i++){
        s->rho_inv_vec[i] = 1. / rho_vec[i];
    }

    // Update KKT matrix with new rho_vec
    update_KKT_param2(s->KKT, s->rho_inv_vec, s->rhotoKKT, s->m);

    return (QDLDL_factor(s->KKT->n, s->KKT->p, s->KKT->i, s->KKT->x,
        s->L->p, s->L->i, s->L->x, s->D, s->Dinv, s->Lnz,
        s->etree, s->bwork, s->iwork, s->fwork) < 0);
}